

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O0

void __thiscall wasm::LocalCSE::doWalkFunction(LocalCSE *this,Function *func)

{
  bool bVar1;
  PassOptions *options_00;
  Module *pMVar2;
  undefined1 local_4e0 [8];
  Applier applier;
  Checker checker;
  undefined1 local_248 [8];
  Scanner scanner;
  RequestInfoMap requestInfos;
  PassOptions *options;
  Function *func_local;
  LocalCSE *this_local;
  
  options_00 = Pass::getPassOptions((Pass *)this);
  anon_unknown_166::RequestInfoMap::RequestInfoMap((RequestInfoMap *)&scanner.connectAdjacentBlocks)
  ;
  anon_unknown_166::Scanner::Scanner
            ((Scanner *)local_248,options_00,(RequestInfoMap *)&scanner.connectAdjacentBlocks);
  pMVar2 = Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
                       ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
                       super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>);
  Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  ::walkFunctionInModule
            ((Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              *)local_248,func,pMVar2);
  bVar1 = std::
          unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ::empty((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                   *)&scanner.connectAdjacentBlocks);
  if (!bVar1) {
    anon_unknown_166::Checker::Checker
              ((Checker *)&applier.connectAdjacentBlocks,options_00,
               (RequestInfoMap *)&scanner.connectAdjacentBlocks);
    pMVar2 = Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
                         ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
                         super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>);
    Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    ::walkFunctionInModule
              ((Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                *)&applier.connectAdjacentBlocks,func,pMVar2);
    bVar1 = std::
            unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            ::empty((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                     *)&scanner.connectAdjacentBlocks);
    if (!bVar1) {
      anon_unknown_166::Applier::Applier
                ((Applier *)local_4e0,(RequestInfoMap *)&scanner.connectAdjacentBlocks);
      pMVar2 = Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
                           ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
                           super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>);
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::walkFunctionInModule
                ((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                  *)local_4e0,func,pMVar2);
      anon_unknown_166::Applier::~Applier((Applier *)local_4e0);
    }
    anon_unknown_166::Checker::~Checker((Checker *)&applier.connectAdjacentBlocks);
  }
  anon_unknown_166::Scanner::~Scanner((Scanner *)local_248);
  anon_unknown_166::RequestInfoMap::~RequestInfoMap
            ((RequestInfoMap *)&scanner.connectAdjacentBlocks);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    auto& options = getPassOptions();

    RequestInfoMap requestInfos;

    Scanner scanner(options, requestInfos);
    scanner.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // We did not find any repeated expressions at all.
      return;
    }

    Checker checker(options, requestInfos);
    checker.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // No repeated expressions remain after checking for effects.
      return;
    }

    Applier applier(requestInfos);
    applier.walkFunctionInModule(func, getModule());
  }